

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

uint ReadVarInt<HashVerifier<AutoFile>,(VarIntMode)0,unsigned_int>(HashVerifier<AutoFile> *is)

{
  CSHA256 *pCVar1;
  ulong uVar2;
  char *pcVar3;
  size_t in_RCX;
  int iVar4;
  uint uVar5;
  long in_FS_OFFSET;
  uchar local_38 [8];
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(is->m_source,(int)local_38,(void *)0x1,in_RCX);
  pCVar1 = CSHA256::Write((CSHA256 *)is,local_38,1);
  uVar2 = CONCAT71((int7)((ulong)pCVar1 >> 8),local_38[0]);
  iVar4 = 0;
  while( true ) {
    uVar5 = (uint)uVar2 & 0x7f | iVar4 << 7;
    if (-1 < (char)uVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return uVar5;
      }
      goto LAB_0021dfb5;
    }
    if (uVar5 == 0xffffffff) break;
    iVar4 = uVar5 + 1;
    AutoFile::read(is->m_source,(int)local_38,(void *)0x1,uVar2 & 0xffffff7f);
    pCVar1 = CSHA256::Write((CSHA256 *)is,local_38,1);
    uVar2 = CONCAT71((int7)((ulong)pCVar1 >> 8),local_38[0]);
    if (0x1fffffe < uVar5) {
      pcVar3 = (char *)__cxa_allocate_exception(0x20);
      local_30 = std::iostream_category();
      local_38[0] = '\x01';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar3,(error_code *)"ReadVarInt(): size too large");
LAB_0021df62:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
LAB_0021dfb5:
      __stack_chk_fail();
    }
  }
  pcVar3 = (char *)__cxa_allocate_exception(0x20);
  local_30 = std::iostream_category();
  local_38[0] = '\x01';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)"ReadVarInt(): size too large");
  goto LAB_0021df62;
}

Assistant:

I ReadVarInt(Stream& is)
{
    CheckVarIntMode<Mode, I>();
    I n = 0;
    while(true) {
        unsigned char chData = ser_readdata8(is);
        if (n > (std::numeric_limits<I>::max() >> 7)) {
           throw std::ios_base::failure("ReadVarInt(): size too large");
        }
        n = (n << 7) | (chData & 0x7F);
        if (chData & 0x80) {
            if (n == std::numeric_limits<I>::max()) {
                throw std::ios_base::failure("ReadVarInt(): size too large");
            }
            n++;
        } else {
            return n;
        }
    }
}